

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::SIMDLoadStoreLane::finalize(SIMDLoadStoreLane *this)

{
  BasicType id;
  bool bVar1;
  bool local_39;
  Type local_28;
  BasicType local_20 [2];
  Type local_18;
  SIMDLoadStoreLane *local_10;
  SIMDLoadStoreLane *this_local;
  
  bVar1 = false;
  if (this->ptr != (Expression *)0x0) {
    bVar1 = this->vec != (Expression *)0x0;
  }
  local_10 = this;
  if (bVar1) {
    bVar1 = isLoad(this);
    id = none;
    if (bVar1) {
      id = v128;
    }
    wasm::Type::Type(&local_18,id);
    (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id =
         local_18.id;
    local_20[1] = 1;
    bVar1 = wasm::Type::operator==(&this->ptr->type,local_20 + 1);
    local_39 = true;
    if (!bVar1) {
      local_20[0] = unreachable;
      local_39 = wasm::Type::operator==(&this->vec->type,local_20);
    }
    if (local_39 != false) {
      wasm::Type::Type(&local_28,unreachable);
      (this->super_SpecificExpression<(wasm::Expression::Id)35>).super_Expression.type.id =
           local_28.id;
    }
    return;
  }
  __assert_fail("ptr && vec",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x1ee,"void wasm::SIMDLoadStoreLane::finalize()");
}

Assistant:

void SIMDLoadStoreLane::finalize() {
  assert(ptr && vec);
  type = isLoad() ? Type::v128 : Type::none;
  if (ptr->type == Type::unreachable || vec->type == Type::unreachable) {
    type = Type::unreachable;
  }
}